

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void nh_keep_alive_handler(http_context_t *context)

{
  uint8_t *puVar1;
  char *value;
  http_string_t hVar2;
  
  if (context->version == HTTP_1_1) {
    hVar2 = get_request_header(context,"Connection");
    if (5 < hVar2.len) {
      puVar1 = &context->session->flags;
      *puVar1 = *puVar1 | 2;
      value = "keep-alive";
      goto LAB_001062da;
    }
  }
  puVar1 = &context->session->flags;
  *puVar1 = *puVar1 & 0xfd;
  value = "close";
LAB_001062da:
  set_response_header(context,"Connection",value);
  return;
}

Assistant:

void nh_keep_alive_handler(http_context_t *context) {
    // just for keep alive now
    if (context->version == HTTP_1_1) {
        http_string_t connection = get_request_header(context, "Connection");
        if (connection.len > 5) {
            // not "close"
            FLAG_SET(context->session->flags, SESSION_FLAG_KEEP_ALIVE);
            set_response_header(context, "Connection", "keep-alive");
            return;
        }
    }
    FLAG_CLEAR(context->session->flags, SESSION_FLAG_KEEP_ALIVE);
    set_response_header(context, "Connection", "close");
}